

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,big_decimal_fp *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  undefined1 uVar1;
  char cVar2;
  byte bVar3;
  undefined1 auVar4 [4];
  numpunct *pnVar5;
  long lVar6;
  basic_appender<char> bVar7;
  int iVar8;
  ulong uVar9;
  int **ppiVar10;
  size_t sVar11;
  uint uVar12;
  int **ppiVar13;
  long lVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  uint uVar17;
  int iVar18;
  buffer<char> *buf;
  int iVar19;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  char *significand;
  int exp;
  anon_class_40_8_fd1bf2f9 write;
  int num_zeros;
  undefined1 local_de [14];
  int local_d0;
  undefined1 local_cc [4];
  format_specs local_c8;
  undefined1 local_b8 [20];
  undefined1 auStack_a4 [20];
  format_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int *local_60;
  int *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_c8.super_basic_specs = (basic_specs)f->significand;
  local_d0 = f->significand_size;
  local_de._6_8_ = ZEXT48((local_d0 + 1) - (uint)(s == none));
  local_de[1] = '0';
  uVar12 = (specs->super_basic_specs).data_;
  cVar2 = '.';
  uVar9 = local_de._6_8_;
  local_cc = (undefined1  [4])s;
  if ((uVar12 >> 0xe & 1) != 0) {
    if (loc.locale_ == (void *)0x0) {
      std::locale::locale((locale *)local_b8);
    }
    else {
      std::locale::locale((locale *)local_b8,(locale *)loc.locale_);
    }
    pnVar5 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)local_b8);
    cVar2 = (**(code **)(*(long *)pnVar5 + 0x10))(pnVar5);
    std::locale::~locale((locale *)local_b8);
    uVar12 = (specs->super_basic_specs).data_;
    uVar9 = local_de._6_8_;
  }
  uVar15 = auStack_a4._4_8_;
  uVar17 = f->exponent;
  iVar19 = local_d0 + uVar17;
  iVar8 = specs->precision;
  bVar3 = (byte)uVar12 & 7;
  local_de[0] = cVar2;
  local_de._6_8_ = out.container;
  if (bVar3 == 1) goto LAB_00141f0e;
  if ((uVar12 & 7) != 2) {
    if (iVar19 < -3) {
LAB_00141f0e:
      iVar18 = local_d0 + uVar17 + -1;
      if ((uVar12 >> 0xd & 1) == 0) {
        uVar17 = 0;
        if (local_d0 == 1) {
          local_de[0] = '\0';
          uVar17 = 0;
        }
      }
      else {
        uVar17 = 0;
        if (0 < iVar8 - local_d0) {
          uVar17 = iVar8 - local_d0;
        }
        uVar9 = uVar9 + uVar17;
      }
      iVar8 = 1 - iVar19;
      if (0 < iVar19) {
        iVar8 = iVar18;
      }
      lVar14 = 2;
      if (99 < iVar8) {
        lVar14 = (ulong)(999 < iVar8) + 3;
      }
      sVar11 = (3 - (ulong)(local_de[0] == '\0')) + uVar9 + lVar14;
      local_b8._0_4_ = local_cc;
      local_b8._8_4_ = local_c8.super_basic_specs.data_;
      local_b8[0xc] = local_c8.super_basic_specs.fill_data_[0];
      local_b8[0xd] = local_c8.super_basic_specs.fill_data_[1];
      local_b8[0xe] = local_c8.super_basic_specs.fill_data_[2];
      local_b8[0xf] = local_c8.super_basic_specs.fill_data_[3];
      auStack_a4[0] = local_de[0];
      local_b8._16_4_ = local_d0;
      auStack_a4._4_5_ = CONCAT14('0',uVar17);
      auStack_a4._10_2_ = SUB82(uVar15,6);
      auStack_a4._4_8_ =
           CONCAT26(auStack_a4._10_2_,CONCAT15(((uVar12 >> 0xc & 1) == 0) << 5,auStack_a4._4_5_)) |
           0x450000000000;
      auStack_a4._12_4_ = iVar18;
      if (specs->width < 1) {
        uVar9 = sVar11 + (out.container)->size_;
        auVar4 = local_cc;
        if ((out.container)->capacity_ < uVar9) {
          (*(out.container)->grow_)(out.container,uVar9);
          auVar4 = (undefined1  [4])local_b8._0_4_;
        }
        if (auVar4 != (undefined1  [4])0x0) {
          sVar11 = (out.container)->size_;
          uVar9 = sVar11 + 1;
          if ((out.container)->capacity_ < uVar9) {
            (*(out.container)->grow_)(out.container,uVar9);
            sVar11 = (out.container)->size_;
            uVar9 = sVar11 + 1;
          }
          (out.container)->size_ = uVar9;
          (out.container)->ptr_[sVar11] = (char)(0x202b2d00 >> ((byte)((int)auVar4 << 3) & 0x1f));
        }
        bVar7 = write_significand<fmt::v11::basic_appender<char>,char>
                          (out,(char *)local_b8._8_8_,local_b8._16_4_,1,auStack_a4[0]);
        if (0 < (int)auStack_a4._4_4_) {
          bVar7 = fill_n<fmt::v11::basic_appender<char>,int,char>
                            (bVar7,auStack_a4._4_4_,auStack_a4 + 8);
        }
        uVar1 = auStack_a4[9];
        sVar11 = (bVar7.container)->size_;
        uVar9 = sVar11 + 1;
        if ((bVar7.container)->capacity_ < uVar9) {
          (*(bVar7.container)->grow_)(bVar7.container,uVar9);
          sVar11 = (bVar7.container)->size_;
          uVar9 = sVar11 + 1;
        }
        (bVar7.container)->size_ = uVar9;
        (bVar7.container)->ptr_[sVar11] = uVar1;
        bVar7 = write_exponent<char,fmt::v11::basic_appender<char>>(auStack_a4._12_4_,bVar7);
      }
      else {
        bVar7 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                          (out,specs,sVar11,sVar11,(anon_class_40_8_fd1bf2f9 *)local_b8);
      }
      return (basic_appender<char>)bVar7.container;
    }
    if (0 < iVar8) {
      exp_upper = iVar8;
    }
    if (exp_upper < iVar19) goto LAB_00141f0e;
  }
  local_c8.precision = iVar19;
  if (-1 < (int)uVar17) {
    lVar14 = uVar17 + uVar9;
    local_de._2_4_ = iVar8 - iVar19;
    if ((uVar12 >> 0xd & 1) != 0) {
      lVar14 = lVar14 + 1;
      if (((int)local_de._2_4_ < 1) && (bVar3 != 2)) {
        local_de._2_4_ = 0;
      }
      else if (0 < (int)local_de._2_4_) {
        lVar14 = lVar14 + (ulong)(uint)local_de._2_4_;
      }
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar12 >> 0xe) & 1));
    iVar8 = 0;
    if (local_48 != (digit_grouping<char> *)0x0) {
      ppiVar13 = (int **)(local_70._8_8_ + local_70._M_allocated_capacity);
      lVar6 = 0;
      uVar15 = local_70._0_8_;
      do {
        if ((int **)uVar15 == ppiVar13) {
          cVar2 = *(char *)((long)ppiVar13 + -1);
          uVar15 = ppiVar13;
        }
        else {
          cVar2 = *(char *)uVar15;
          if ((byte)(cVar2 + 0x81U) < 0x82) goto LAB_001421bf;
          uVar15 = (int **)(uVar15 + 1);
        }
        iVar8 = iVar8 + cVar2;
        if (iVar19 <= iVar8) goto LAB_001421bf;
        lVar6 = lVar6 + 1;
      } while( true );
    }
    lVar6 = 0;
LAB_001421bf:
    local_b8._0_8_ = local_cc;
    local_b8._8_8_ = &local_c8;
    unique0x00004e80 = &local_d0;
    local_88._M_allocated_capacity = (size_type)local_de;
    local_88._8_8_ = local_de + 2;
    local_78 = local_de + 1;
    auStack_a4._4_8_ = f;
    auStack_a4._12_8_ = &local_70;
    local_90 = specs;
    bVar7 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                      ((basic_appender<char>)local_de._6_8_,specs,lVar14 + lVar6,lVar14 + lVar6,
                       (anon_class_72_9_eb40e20e *)local_b8);
    if (local_50 != &local_40) {
      operator_delete(local_50,(ulong)(local_40._M_allocated_capacity + 1));
    }
    uVar15 = local_60;
    uVar16 = local_70._0_8_;
    if ((int **)local_70._0_8_ == &local_60) {
      return (basic_appender<char>)bVar7.container;
    }
LAB_00142384:
    operator_delete((void *)uVar16,uVar15 + 1);
    return (basic_appender<char>)bVar7.container;
  }
  if (0 < iVar19) {
    iVar18 = 0;
    local_de._2_4_ = iVar8 - local_d0 & (int)(uVar12 << 0x12) >> 0x1f;
    uVar17 = local_de._2_4_;
    if ((int)local_de._2_4_ < 1) {
      uVar17 = 0;
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)local_b8,loc,(bool)((byte)(uVar12 >> 0xe) & 1));
    if (local_90 != (format_specs *)0x0) {
      ppiVar10 = (int **)(local_b8._0_8_ + (long)(basic_specs *)local_b8._8_8_);
      lVar14 = 0;
      ppiVar13 = (int **)local_b8._0_8_;
      do {
        if (ppiVar13 == ppiVar10) {
          cVar2 = *(char *)((long)ppiVar10 + -1);
          ppiVar13 = ppiVar10;
        }
        else {
          cVar2 = *(char *)ppiVar13;
          if ((byte)(cVar2 + 0x81U) < 0x82) goto LAB_001422f3;
          ppiVar13 = (int **)((long)ppiVar13 + 1);
        }
        iVar18 = iVar18 + cVar2;
        if (iVar19 <= iVar18) goto LAB_001422f3;
        lVar14 = lVar14 + 1;
      } while( true );
    }
    lVar14 = 0;
LAB_001422f3:
    sVar11 = uVar17 + uVar9 + lVar14 + 1;
    local_70._M_allocated_capacity = (size_type)local_cc;
    local_70._8_8_ = &local_c8;
    local_60 = &local_d0;
    local_58 = &local_c8.precision;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_de;
    local_40._M_allocated_capacity = (size_type)(local_de + 2);
    local_40._8_8_ = local_de + 1;
    local_48 = (digit_grouping<char> *)local_b8;
    bVar7 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                      ((basic_appender<char>)local_de._6_8_,specs,sVar11,sVar11,
                       (anon_class_64_8_085c650e *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_a4._12_8_ != &local_88) {
      operator_delete((void *)auStack_a4._12_8_,(ulong)(local_88._M_allocated_capacity + 1));
    }
    uVar15 = stack0xffffffffffffff58;
    uVar16 = local_b8._0_8_;
    if ((undefined1 *)local_b8._0_8_ == local_b8 + 0x10) {
      return (basic_appender<char>)bVar7.container;
    }
    goto LAB_00142384;
  }
  iVar18 = -iVar19;
  local_70._M_allocated_capacity._0_4_ = iVar18;
  if (local_d0 == 0) {
    if ((-1 < iVar8) && (SBORROW4(iVar8,iVar18) != iVar8 + iVar19 < 0)) {
      local_70._M_allocated_capacity._0_4_ = iVar8;
      iVar18 = iVar8;
    }
    if (iVar18 == 0) {
      local_de[2] = (char)((uVar12 & 0x2000) >> 0xd);
      iVar8 = 2 - (uint)((uVar12 & 0x2000) == 0);
      iVar18 = 0;
      goto LAB_0014228a;
    }
  }
  local_de[2] = 1;
  iVar8 = 2;
LAB_0014228a:
  sVar11 = (uint)(iVar18 + iVar8) + uVar9;
  local_b8._0_8_ = local_cc;
  local_b8._8_8_ = local_de + 2;
  unique0x00004e80 = local_de;
  auStack_a4._4_8_ = &local_70;
  auStack_a4._12_8_ = local_de + 1;
  local_90 = &local_c8;
  local_88._M_allocated_capacity = (size_type)&local_d0;
  bVar7 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                    (out,specs,sVar11,sVar11,(anon_class_56_7_88befd79 *)local_b8);
  return (basic_appender<char>)bVar7.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}